

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

uint64_t cpu_mapping_to_gpu_addr(cpu_mapping *mapping,uint64_t offset)

{
  ulong uVar1;
  gpu_mapping *local_40;
  gpu_mapping *gpu_mapping;
  uint64_t off;
  gpu_object *obj;
  uint64_t gpu_addr;
  uint64_t offset_local;
  cpu_mapping *mapping_local;
  
  obj = (gpu_object *)0x0;
  uVar1 = mapping->object_offset + offset;
  if (mapping->object == (gpu_object *)0x0) {
    mapping_local = (cpu_mapping *)0x0;
  }
  else {
    for (local_40 = mapping->object->gpu_mappings;
        (local_40 != (gpu_mapping *)0x0 &&
        ((uVar1 < local_40->object_offset || (local_40->object_offset + local_40->length <= uVar1)))
        ); local_40 = local_40->next) {
    }
    if (local_40 != (gpu_mapping *)0x0) {
      obj = (gpu_object *)(local_40->address + (uVar1 - local_40->object_offset));
    }
    mapping_local = (cpu_mapping *)obj;
  }
  return (uint64_t)mapping_local;
}

Assistant:

uint64_t cpu_mapping_to_gpu_addr(struct cpu_mapping *mapping, uint64_t offset)
{
	uint64_t gpu_addr = 0;
	struct gpu_object *obj = mapping->object;
	uint64_t off = mapping->object_offset + offset;

	if (!obj)
		return 0;

	struct gpu_mapping *gpu_mapping;
	for (gpu_mapping = obj->gpu_mappings; gpu_mapping != NULL; gpu_mapping = gpu_mapping->next)
		if (off >= gpu_mapping->object_offset &&
			off <  gpu_mapping->object_offset + gpu_mapping->length)
			break;

	if (gpu_mapping)
		gpu_addr = gpu_mapping->address + (off - gpu_mapping->object_offset);

	return gpu_addr;
}